

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O3

REF_STATUS multiscale(REF_MPI ref_mpi,int argc,char **argv)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined4 extraout_var;
  REF_DBL *hh;
  REF_RECON_RECONSTRUCTION reconstruction;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  REF_INT p;
  REF_GRID_conflict pRVar9;
  REF_DICT in_stack_ffffffffffffff38;
  REF_INT pos;
  REF_GRID_conflict ref_grid;
  REF_DBL *local_b0;
  double local_a8;
  REF_DICT ref_dict_bcs;
  char *local_98;
  double local_90;
  undefined8 local_88;
  uint local_80;
  uint local_7c;
  REF_DBL *scalar;
  double local_70;
  char *local_68;
  REF_INT fixed_point_pos;
  REF_INT hessian_pos;
  REF_INT ldim;
  double local_50;
  char in_project [1];
  REF_DBL current_complexity;
  
  ref_grid = (REF_GRID_conflict)0x0;
  scalar = (REF_DBL *)0x0;
  ref_dict_bcs = (REF_DICT)0x0;
  if (argc < 6) goto LAB_00119e48;
  pcVar8 = argv[2];
  local_98 = argv[3];
  local_a8 = atof(argv[4]);
  pcVar1 = argv[5];
  uVar2 = ref_args_find(argc,argv,"--norm-power",&pos);
  if ((uVar2 != 0) && (uVar2 != 5)) {
    pcVar8 = "arg search";
    uVar6 = 0xf3a;
    goto LAB_00119ef6;
  }
  if ((long)pos != -1) {
    if (pos < argc + -1) {
      local_68 = pcVar1;
      iVar3 = atoi(argv[(long)pos + 1]);
      local_88 = CONCAT44(extraout_var,iVar3);
      goto LAB_00119f0f;
    }
    if (ref_mpi->id != 0) goto LAB_00119e48;
    pcVar8 = "option missing value: --norm-power <norm power>";
LAB_0011a105:
    puts(pcVar8);
LAB_00119e48:
    if (ref_mpi->id == 0) {
      multiscale_help(*argv);
    }
    return 1;
  }
  local_88 = 2;
  local_68 = pcVar1;
LAB_00119f0f:
  uVar4 = ref_args_find(argc,argv,"--gradation",&pos);
  if ((uVar4 != 0) && (uVar4 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xf46,"multiscale",(ulong)uVar4,"arg search");
    uVar2 = uVar4;
  }
  if ((uVar4 != 5) && (uVar4 != 0)) {
    return uVar2;
  }
  if ((long)pos == -1) {
    local_90 = -1.0;
  }
  else {
    if (argc + -1 <= pos) {
      if (ref_mpi->id != 0) goto LAB_00119e48;
      pcVar8 = "option missing value: --gradation <gradation>";
      goto LAB_0011a105;
    }
    local_90 = atof(argv[(long)pos + 1]);
  }
  uVar4 = ref_args_find(argc,argv,"--hessian",&hessian_pos);
  if ((uVar4 != 0) && (uVar4 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xf51,"multiscale",(ulong)uVar4,"arg search");
    uVar2 = uVar4;
  }
  if ((uVar4 != 5) && (uVar4 != 0)) {
    return uVar2;
  }
  uVar4 = ref_args_find(argc,argv,"--fixed-point",&fixed_point_pos);
  if ((uVar4 != 0) && (uVar4 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xf53,"multiscale",(ulong)uVar4,"arg search");
    uVar2 = uVar4;
  }
  if ((uVar4 != 5) && (uVar4 != 0)) {
    return uVar2;
  }
  uVar4 = ref_args_find(argc,argv,"--aspect-ratio",&pos);
  if ((uVar4 != 0) && (uVar4 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xf57,"multiscale",(ulong)uVar4,"arg search");
    uVar2 = uVar4;
  }
  if ((uVar4 != 5) && (uVar4 != 0)) {
    return uVar2;
  }
  if ((long)pos == -1) {
    local_70 = -1.0;
  }
  else {
    if (argc + -1 <= pos) {
      if (ref_mpi->id != 0) goto LAB_00119e48;
      pcVar8 = "option missing value: --aspect-ratio <aspect-ratio>";
      goto LAB_0011a105;
    }
    local_70 = atof(argv[(long)pos + 1]);
  }
  uVar4 = ref_dict_create(&ref_dict_bcs);
  if (uVar4 != 0) {
    pcVar8 = "make dict";
    uVar6 = 0xf61;
    goto LAB_0011a14e;
  }
  uVar4 = ref_args_find(argc,argv,"--fun3d-mapbc",&pos);
  if ((uVar4 != 0) && (uVar4 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xf63,"multiscale",(ulong)uVar4,"arg search");
    uVar2 = uVar4;
  }
  if ((uVar4 != 5) && (uVar4 != 0)) {
    return uVar2;
  }
  local_b0 = (REF_DBL *)CONCAT44(local_b0._4_4_,argc + -1);
  if (pos < argc + -1 && pos != -1) {
    if (ref_mpi->id == 0) {
      pcVar1 = argv[(long)pos + 1];
      printf("reading fun3d bc map %s\n",pcVar1);
      uVar4 = ref_phys_read_mapbc(ref_dict_bcs,pcVar1);
      if (uVar4 != 0) {
        pcVar8 = "unable to read fun3d formatted mapbc";
        uVar6 = 0xf6a;
        goto LAB_0011a14e;
      }
    }
    uVar4 = ref_dict_bcast(ref_dict_bcs,ref_mpi);
    if (uVar4 != 0) {
      pcVar8 = "bcast";
      uVar6 = 0xf6c;
      goto LAB_0011a14e;
    }
  }
  uVar4 = ref_args_find(argc,argv,"--viscous-tags",&pos);
  if ((uVar4 != 0) && (uVar4 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xf70,"multiscale",(ulong)uVar4,"arg search");
    uVar2 = uVar4;
  }
  if ((uVar4 != 5) && (uVar4 != 0)) {
    return uVar2;
  }
  if (pos < (int)local_b0 && pos != -1) {
    if (ref_mpi->id == 0) {
      pcVar1 = argv[(long)pos + 1];
      puts("parsing viscous tags");
      uVar4 = ref_phys_parse_tags(ref_dict_bcs,pcVar1);
      if (uVar4 != 0) {
        pcVar8 = "unable to parse viscous tags";
        uVar6 = 0xf77;
        goto LAB_0011a14e;
      }
      printf(" %d viscous tags parsed\n",(ulong)(uint)ref_dict_bcs->n);
    }
    uVar4 = ref_dict_bcast(ref_dict_bcs,ref_mpi);
    if (uVar4 != 0) {
      pcVar8 = "bcast";
      uVar6 = 0xf7a;
      goto LAB_0011a14e;
    }
  }
  if (ref_mpi->id == 0) {
    printf("complexity %f\n",local_a8);
    printf("Lp=%d\n",local_88);
    printf("gradation %f\n",local_90);
    printf("reconstruction %d\n",0);
  }
  if (local_a8 <= 1e-20) {
    pcVar8 = "complexity must be greater than zero";
    uVar6 = 0xf83;
LAB_0011a43e:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           uVar6,"multiscale",pcVar8);
    return 1;
  }
  ref_mpi_stopwatch_start(ref_mpi);
  if (ref_mpi->n < 2) {
    if (ref_mpi->id == 0) {
      printf("import %s\n",pcVar8);
    }
    uVar4 = ref_import_by_extension(&ref_grid,ref_mpi,pcVar8);
    if (uVar4 != 0) {
      pcVar8 = "import";
      uVar6 = 0xf8d;
      goto LAB_0011a14e;
    }
    pcVar8 = "import";
  }
  else {
    if (ref_mpi->id == 0) {
      printf("part %s\n",pcVar8);
    }
    uVar4 = ref_part_by_extension(&ref_grid,ref_mpi,pcVar8);
    if (uVar4 != 0) {
      pcVar8 = "part";
      uVar6 = 0xf89;
      goto LAB_0011a14e;
    }
    pcVar8 = "part";
  }
  ref_mpi_stopwatch_stop(ref_mpi,pcVar8);
  if (ref_mpi->id == 0) {
    printf("  read %ld vertices\n",ref_grid->node->old_n_global);
  }
  pRVar9 = ref_grid;
  uVar4 = ref_grid->node->max;
  if ((int)uVar4 < 0) {
    pcVar8 = "malloc metric of REF_DBL negative";
    uVar6 = 0xf94;
    goto LAB_0011a43e;
  }
  local_b0 = (REF_DBL *)malloc((ulong)uVar4 * 0x30);
  if (local_b0 == (REF_DBL *)0x0) {
    pcVar8 = "malloc metric of REF_DBL NULL";
    uVar6 = 0xf94;
LAB_0011a696:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           uVar6,"multiscale",pcVar8);
    return 2;
  }
  lVar7 = (long)fixed_point_pos;
  if (lVar7 == -1) {
    if (hessian_pos == -1) {
      if (ref_mpi->id == 0) {
        printf("part scalar %s\n",local_98);
        pRVar9 = ref_grid;
      }
      uVar4 = ref_part_scalar(pRVar9,&ldim,&scalar,local_98);
      if (uVar4 != 0) {
        pcVar8 = "part scalar";
        uVar6 = 0xfb8;
        goto LAB_0011a14e;
      }
      if ((long)ldim != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0xfb9,"multiscale","expected one scalar",1,(long)ldim);
        return 1;
      }
      ref_mpi_stopwatch_stop(ref_mpi,"part scalar");
      if (ref_mpi->id == 0) {
        puts("reconstruct Hessian, compute metric");
      }
      reconstruction = REF_RECON_L2PROJECTION;
      uVar4 = ref_metric_lp(local_b0,ref_grid,scalar,REF_RECON_L2PROJECTION,(REF_INT)local_88,
                            local_90,local_70,local_a8);
      if (uVar4 != 0) {
        pcVar8 = "lp norm";
        uVar6 = 0xfbf;
        goto LAB_0011a14e;
      }
      ref_mpi_stopwatch_stop(ref_mpi,"compute metric");
      uVar4 = ref_subcommand_report_error(local_b0,ref_grid,scalar,reconstruction,local_a8);
      if (uVar4 != 0) {
        pcVar8 = "report error";
        uVar6 = 0xfc3;
        goto LAB_0011a14e;
      }
      if (scalar != (REF_DBL *)0x0) {
        free(scalar);
      }
    }
    else {
      uVar4 = hessian_multiscale(ref_mpi,pRVar9,local_98,local_b0,(REF_INT)local_88,local_90,
                                 local_a8);
      if (uVar4 != 0) {
        pcVar8 = "hessian multiscale";
        uVar6 = 0xfb5;
        goto LAB_0011a14e;
      }
    }
  }
  else {
    _in_project = (char *)((ulong)_in_project & 0xffffffffffffff00);
    local_98 = argv[lVar7 + 1];
    local_7c = atoi(argv[lVar7 + 2]);
    local_80 = atoi(argv[lVar7 + 3]);
    uVar4 = atoi(argv[lVar7 + 4]);
    uVar5 = ref_args_find(argc,argv,"--strong-sensor-bc",&pos);
    if ((uVar5 != 0) && (uVar5 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0xfa1,"multiscale",(ulong)uVar5,"arg search");
      uVar2 = uVar5;
    }
    if ((uVar5 != 5) && (uVar5 != 0)) {
      return uVar2;
    }
    if ((long)pos == -1) {
      p = 0;
      local_50 = 0.0;
    }
    else {
      if (argc <= pos + 1) {
        pcVar8 = "--strong-sensor-bc <value>";
        uVar6 = 0xfa3;
        goto LAB_0011a43e;
      }
      local_50 = atof(argv[(long)pos + 1]);
      p = 1;
    }
    if (ref_mpi->id == 0) {
      puts("--fixed-point");
      printf("    %s%s solb project\n",in_project,local_98);
      printf("    timesteps [%d ... %d ... %d]\n",(ulong)local_7c,(ulong)local_80,(ulong)uVar4);
    }
    uVar4 = fixed_point_metric(local_b0,ref_grid,local_7c,uVar4,local_80,in_project,local_98,
                               (REF_RECON_RECONSTRUCTION)local_88,p,local_90,local_a8,local_70,
                               (REF_BOOL)ref_dict_bcs,local_50,in_stack_ffffffffffffff38);
    if (uVar4 != 0) {
      pcVar8 = "fixed point";
      uVar6 = 0xfb1;
      goto LAB_0011a14e;
    }
  }
  uVar4 = ref_args_find(argc,argv,"--buffer",&pos);
  if ((uVar4 != 0) && (uVar4 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xfc7,"multiscale",(ulong)uVar4,"arg search");
    uVar2 = uVar4;
  }
  if ((uVar4 != 5) && (uVar4 != 0)) {
    return uVar2;
  }
  if (pos != -1) {
    if (ref_mpi->id == 0) {
      printf("buffer at complexity %e\n",local_a8);
    }
    uVar4 = ref_metric_buffer_at_complexity(local_b0,ref_grid,local_a8);
    if (uVar4 != 0) {
      pcVar8 = "buffer at complexity";
      uVar6 = 0xfcb;
      goto LAB_0011a14e;
    }
    ref_mpi_stopwatch_stop(ref_mpi,"buffer");
  }
  uVar4 = ref_args_find(argc,argv,"--uniform",&pos);
  if ((uVar4 != 0) && (uVar4 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xfd0,"multiscale",(ulong)uVar4,"arg search");
    uVar2 = uVar4;
  }
  if ((uVar4 != 5) && (uVar4 != 0)) {
    return uVar2;
  }
  if ((pos != -1) && (uVar4 = ref_metric_parse(local_b0,ref_grid,argc,argv), uVar4 != 0)) {
    pcVar8 = "parse uniform";
    uVar6 = 0xfd2;
LAB_0011a14e:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           uVar6,"multiscale",(ulong)uVar4,pcVar8);
    return uVar4;
  }
  uVar4 = ref_metric_complexity(local_b0,ref_grid,&current_complexity);
  if (uVar4 != 0) {
    pcVar8 = "cmp";
    uVar6 = 0xfd5;
    goto LAB_0011a14e;
  }
  if (ref_mpi->id == 0) {
    printf("actual complexity %e\n",current_complexity);
  }
  uVar4 = ref_metric_to_node(local_b0,ref_grid->node);
  if (uVar4 != 0) {
    pcVar8 = "set node";
    uVar6 = 0xfd8;
    goto LAB_0011a14e;
  }
  uVar4 = ref_args_find(argc,argv,"--pcd",&pos);
  if ((uVar4 != 0) && (uVar4 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xfda,"multiscale",(ulong)uVar4,"arg search");
    uVar2 = uVar4;
  }
  pRVar9 = ref_grid;
  if ((uVar4 != 5) && (uVar4 != 0)) {
    return uVar2;
  }
  if (pos + 1 < argc && pos != -1) {
    _in_project = "spacing";
    uVar2 = ref_grid->node->max;
    if ((int)uVar2 < 0) {
      pcVar8 = "malloc hh of REF_DBL negative";
      uVar6 = 0xfde;
      _in_project = "spacing";
      goto LAB_0011a43e;
    }
    hh = (REF_DBL *)malloc((ulong)uVar2 << 4);
    if (hh == (REF_DBL *)0x0) {
      pcVar8 = "malloc hh of REF_DBL NULL";
      uVar6 = 0xfde;
      goto LAB_0011a696;
    }
    uVar2 = ref_metric_isotropic(local_b0,pRVar9,hh);
    if (uVar2 != 0) {
      pcVar8 = "iso";
      uVar6 = 0xfdf;
      goto LAB_00119ef6;
    }
    ref_mpi_stopwatch_stop(ref_mpi,"isotropic");
    if (ref_mpi->id == 0) {
      printf("gather %s\n",argv[(long)pos + 1]);
    }
    uVar2 = ref_gather_scalar_by_extension(ref_grid,2,hh,(char **)in_project,argv[(long)pos + 1]);
    if (uVar2 != 0) {
      pcVar8 = "dump hh";
      uVar6 = 0xfe3;
      goto LAB_00119ef6;
    }
    free(hh);
  }
  free(local_b0);
  if (ref_mpi->id == 0) {
    printf("gather %s\n",local_68);
  }
  uVar2 = ref_gather_metric(ref_grid,local_68);
  if (uVar2 == 0) {
    ref_mpi_stopwatch_stop(ref_mpi,"gather metric");
    uVar2 = ref_dict_free(ref_dict_bcs);
    if (uVar2 == 0) {
      uVar2 = ref_grid_free(ref_grid);
      if (uVar2 == 0) {
        return 0;
      }
      pcVar8 = "free grid";
      uVar6 = 0xfee;
    }
    else {
      pcVar8 = "free";
      uVar6 = 0xfed;
    }
  }
  else {
    pcVar8 = "gather metric";
    uVar6 = 0xfea;
  }
LAB_00119ef6:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
         uVar6,"multiscale",(ulong)uVar2,pcVar8);
  return uVar2;
}

Assistant:

static REF_STATUS multiscale(REF_MPI ref_mpi, int argc, char *argv[]) {
  char *out_metric;
  char *in_mesh;
  char *in_scalar;
  REF_GRID ref_grid = NULL;
  REF_INT ldim;
  REF_DBL *scalar = NULL;
  REF_DBL *metric = NULL;
  REF_INT p;
  REF_DBL gradation, complexity, current_complexity;
  REF_RECON_RECONSTRUCTION reconstruction = REF_RECON_L2PROJECTION;
  REF_INT pos;
  REF_INT hessian_pos, fixed_point_pos;
  REF_DBL aspect_ratio = -1.0;
  REF_DICT ref_dict_bcs = NULL;

  if (argc < 6) goto shutdown;
  in_mesh = argv[2];
  in_scalar = argv[3];
  complexity = atof(argv[4]);
  out_metric = argv[5];

  p = 2;
  RXS(ref_args_find(argc, argv, "--norm-power", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    if (pos >= argc - 1) {
      if (ref_mpi_once(ref_mpi))
        printf("option missing value: --norm-power <norm power>\n");
      goto shutdown;
    }
    p = atoi(argv[pos + 1]);
  }

  gradation = -1.0;
  RXS(ref_args_find(argc, argv, "--gradation", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    if (pos >= argc - 1) {
      if (ref_mpi_once(ref_mpi))
        printf("option missing value: --gradation <gradation>\n");
      goto shutdown;
    }
    gradation = atof(argv[pos + 1]);
  }

  RXS(ref_args_find(argc, argv, "--hessian", &hessian_pos), REF_NOT_FOUND,
      "arg search");
  RXS(ref_args_find(argc, argv, "--fixed-point", &fixed_point_pos),
      REF_NOT_FOUND, "arg search");

  aspect_ratio = -1.0;
  RXS(ref_args_find(argc, argv, "--aspect-ratio", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    if (pos >= argc - 1) {
      if (ref_mpi_once(ref_mpi))
        printf("option missing value: --aspect-ratio <aspect-ratio>\n");
      goto shutdown;
    }
    aspect_ratio = atof(argv[pos + 1]);
  }

  RSS(ref_dict_create(&ref_dict_bcs), "make dict");
  RXS(ref_args_find(argc, argv, "--fun3d-mapbc", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos && pos < argc - 1) {
    const char *mapbc;
    mapbc = argv[pos + 1];
    if (ref_mpi_once(ref_mpi)) {
      printf("reading fun3d bc map %s\n", mapbc);
      RSS(ref_phys_read_mapbc(ref_dict_bcs, mapbc),
          "unable to read fun3d formatted mapbc");
    }
    RSS(ref_dict_bcast(ref_dict_bcs, ref_mpi), "bcast");
  }

  RXS(ref_args_find(argc, argv, "--viscous-tags", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos && pos < argc - 1) {
    const char *tags;
    tags = argv[pos + 1];
    if (ref_mpi_once(ref_mpi)) {
      printf("parsing viscous tags\n");
      RSS(ref_phys_parse_tags(ref_dict_bcs, tags),
          "unable to parse viscous tags");
      printf(" %d viscous tags parsed\n", ref_dict_n(ref_dict_bcs));
    }
    RSS(ref_dict_bcast(ref_dict_bcs, ref_mpi), "bcast");
  }

  if (ref_mpi_once(ref_mpi)) {
    printf("complexity %f\n", complexity);
    printf("Lp=%d\n", p);
    printf("gradation %f\n", gradation);
    printf("reconstruction %d\n", (int)reconstruction);
  }
  RAS(complexity > 1.0e-20, "complexity must be greater than zero");

  ref_mpi_stopwatch_start(ref_mpi);

  if (ref_mpi_para(ref_mpi)) {
    if (ref_mpi_once(ref_mpi)) printf("part %s\n", in_mesh);
    RSS(ref_part_by_extension(&ref_grid, ref_mpi, in_mesh), "part");
    ref_mpi_stopwatch_stop(ref_mpi, "part");
  } else {
    if (ref_mpi_once(ref_mpi)) printf("import %s\n", in_mesh);
    RSS(ref_import_by_extension(&ref_grid, ref_mpi, in_mesh), "import");
    ref_mpi_stopwatch_stop(ref_mpi, "import");
  }
  if (ref_mpi_once(ref_mpi))
    printf("  read " REF_GLOB_FMT " vertices\n",
           ref_node_n_global(ref_grid_node(ref_grid)));

  ref_malloc(metric, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  if (REF_EMPTY != fixed_point_pos) {
    REF_INT first_timestep, last_timestep, timestep_increment;
    const char *solb_middle;
    const char in_project[] = "";
    REF_BOOL strong_sensor_bc = REF_FALSE;
    REF_DBL strong_value = 0.0;
    solb_middle = argv[fixed_point_pos + 1];
    first_timestep = atoi(argv[fixed_point_pos + 2]);
    timestep_increment = atoi(argv[fixed_point_pos + 3]);
    last_timestep = atoi(argv[fixed_point_pos + 4]);
    RXS(ref_args_find(argc, argv, "--strong-sensor-bc", &pos), REF_NOT_FOUND,
        "arg search");
    if (REF_EMPTY != pos) {
      RAS(pos + 1 < argc, "--strong-sensor-bc <value>");
      strong_sensor_bc = REF_TRUE;
      strong_value = atof(argv[pos + 1]);
    }
    if (ref_mpi_once(ref_mpi)) {
      printf("--fixed-point\n");
      printf("    %s%s solb project\n", in_project, solb_middle);
      printf("    timesteps [%d ... %d ... %d]\n", first_timestep,
             timestep_increment, last_timestep);
    }
    RSS(fixed_point_metric(
            metric, ref_grid, first_timestep, last_timestep, timestep_increment,
            in_project, solb_middle, reconstruction, p, gradation, complexity,
            aspect_ratio, strong_sensor_bc, strong_value, ref_dict_bcs),
        "fixed point");
  } else if (REF_EMPTY != hessian_pos) {
    RSS(hessian_multiscale(ref_mpi, ref_grid, in_scalar, metric, p, gradation,
                           complexity),
        "hessian multiscale");
  } else {
    if (ref_mpi_once(ref_mpi)) printf("part scalar %s\n", in_scalar);
    RSS(ref_part_scalar(ref_grid, &ldim, &scalar, in_scalar), "part scalar");
    REIS(1, ldim, "expected one scalar");
    ref_mpi_stopwatch_stop(ref_mpi, "part scalar");

    if (ref_mpi_once(ref_mpi)) printf("reconstruct Hessian, compute metric\n");
    RSS(ref_metric_lp(metric, ref_grid, scalar, reconstruction, p, gradation,
                      aspect_ratio, complexity),
        "lp norm");
    ref_mpi_stopwatch_stop(ref_mpi, "compute metric");
    RSS(ref_subcommand_report_error(metric, ref_grid, scalar, reconstruction,
                                    complexity),
        "report error");
    ref_free(scalar);
  }

  RXS(ref_args_find(argc, argv, "--buffer", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos) {
    if (ref_mpi_once(ref_mpi)) printf("buffer at complexity %e\n", complexity);
    RSS(ref_metric_buffer_at_complexity(metric, ref_grid, complexity),
        "buffer at complexity");
    ref_mpi_stopwatch_stop(ref_mpi, "buffer");
  }

  RXS(ref_args_find(argc, argv, "--uniform", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    RSS(ref_metric_parse(metric, ref_grid, argc, argv), "parse uniform");
  }

  RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
  if (ref_mpi_once(ref_mpi))
    printf("actual complexity %e\n", current_complexity);
  RSS(ref_metric_to_node(metric, ref_grid_node(ref_grid)), "set node");

  RXS(ref_args_find(argc, argv, "--pcd", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos && pos + 1 < argc) {
    REF_DBL *hh;
    const char *title[] = {"spacing", "decay"};
    ref_malloc(hh, 2 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
    RSS(ref_metric_isotropic(metric, ref_grid, hh), "iso");
    ref_mpi_stopwatch_stop(ref_mpi, "isotropic");
    if (ref_mpi_once(ref_mpi)) printf("gather %s\n", argv[pos + 1]);
    RSS(ref_gather_scalar_by_extension(ref_grid, 2, hh, title, argv[pos + 1]),
        "dump hh");
    ref_free(hh);
  }

  ref_free(metric);

  if (ref_mpi_once(ref_mpi)) printf("gather %s\n", out_metric);
  RSS(ref_gather_metric(ref_grid, out_metric), "gather metric");
  ref_mpi_stopwatch_stop(ref_mpi, "gather metric");

  RSS(ref_dict_free(ref_dict_bcs), "free");
  RSS(ref_grid_free(ref_grid), "free grid");

  return REF_SUCCESS;
shutdown:
  if (ref_mpi_once(ref_mpi)) multiscale_help(argv[0]);
  return REF_FAILURE;
}